

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::dump(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *val,bool pretty_print,bool ensure_ascii,uint indent_step,uint current_indent)

{
  _func_int **pp_Var1;
  pointer pbVar2;
  size_t sVar3;
  string_t *psVar4;
  object_t *poVar5;
  _Base_ptr p_Var6;
  uchar *puVar7;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  char *pcVar8;
  pointer pcVar9;
  element_type *peVar10;
  size_t cnt;
  ulong uVar11;
  pointer pbVar12;
  ulong uVar13;
  const_iterator i;
  uchar *puVar14;
  uint uVar15;
  undefined8 uStack_50;
  
  if (discarded < val->m_type) {
    return;
  }
  switch(val->m_type) {
  case null:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar10->_vptr_output_adapter_protocol[1];
    pcVar8 = "null";
    break;
  case object:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pp_Var1 = peVar10->_vptr_output_adapter_protocol;
    if ((((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      UNRECOVERED_JUMPTABLE_00 = pp_Var1[1];
      pcVar8 = "{}";
      goto LAB_0012ce05;
    }
    if (pretty_print) {
      (*pp_Var1[1])(peVar10,"{\n",2);
      uVar15 = indent_step + current_indent;
      uVar11 = (this->indent_string)._M_string_length;
      if (uVar11 < uVar15) {
        std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar11 * '\x02');
      }
      poVar5 = (val->m_value).object;
      p_Var6 = (poVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      uVar11 = 0;
      while( true ) {
        sVar3 = (poVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar10->_vptr_output_adapter_protocol[1])
                  (peVar10,(this->indent_string)._M_dataplus._M_p,(ulong)uVar15);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x22);
        dump_escaped(this,(string_t *)(p_Var6 + 1),ensure_ascii);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\": ",3);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(p_Var6 + 2),true,ensure_ascii,indent_step,uVar15);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        if (sVar3 - 1 <= uVar11) break;
        (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,",\n",2);
        uVar11 = uVar11 + 1;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        poVar5 = (val->m_value).object;
      }
      (**peVar10->_vptr_output_adapter_protocol)(peVar10,10);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      pcVar9 = (this->indent_string)._M_dataplus._M_p;
      goto LAB_0012d021;
    }
    (**pp_Var1)(peVar10,0x7b);
    poVar5 = (val->m_value).object;
    p_Var6 = (poVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar11 = 0;
    while( true ) {
      sVar3 = (poVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x22);
      dump_escaped(this,(string_t *)(p_Var6 + 1),ensure_ascii);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\":",2);
      dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)(p_Var6 + 2),false,ensure_ascii,indent_step,current_indent);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = *peVar10->_vptr_output_adapter_protocol;
      if (sVar3 - 1 <= uVar11) break;
      (*UNRECOVERED_JUMPTABLE_00)(peVar10,0x2c);
      uVar11 = uVar11 + 1;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      poVar5 = (val->m_value).object;
    }
    goto LAB_0012d030;
  case array:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pp_Var1 = peVar10->_vptr_output_adapter_protocol;
    if ((((val->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (((val->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if (pretty_print) {
        (*pp_Var1[1])(peVar10,"[\n",2);
        uVar15 = current_indent + indent_step;
        uVar11 = (this->indent_string)._M_string_length;
        if (uVar11 < uVar15) {
          std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar11 * '\x02');
        }
        psVar4 = (string_t *)(val->m_value).array;
        for (pbVar12 = (((_Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)&psVar4->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
            pbVar2 = (pointer)psVar4->_M_string_length,
            peVar10 = (this->o).
                      super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,
            (*peVar10->_vptr_output_adapter_protocol[1])
                      (peVar10,(this->indent_string)._M_dataplus._M_p,(ulong)uVar15),
            pbVar12 != pbVar2 + -1; pbVar12 = pbVar12 + 1) {
          dump(this,pbVar12,true,ensure_ascii,indent_step,uVar15);
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,",\n",2);
          psVar4 = (val->m_value).string;
        }
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(((val->m_value).string)->_M_string_length - 0x10),true,ensure_ascii,
             indent_step,uVar15);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar10->_vptr_output_adapter_protocol)(peVar10,10);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar10->_vptr_output_adapter_protocol[1])
                  (peVar10,(this->indent_string)._M_dataplus._M_p,(ulong)current_indent);
      }
      else {
        (**pp_Var1)(peVar10,0x5b);
        psVar4 = (string_t *)(val->m_value).array;
        for (pbVar12 = (((_Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)&psVar4->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
            pbVar12 != (pointer)psVar4->_M_string_length + -1; pbVar12 = pbVar12 + 1) {
          dump(this,pbVar12,false,ensure_ascii,indent_step,current_indent);
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x2c);
          psVar4 = (val->m_value).string;
        }
        dump(this,(pointer)psVar4->_M_string_length + -1,false,ensure_ascii,indent_step,
             current_indent);
      }
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = *peVar10->_vptr_output_adapter_protocol;
      uStack_50 = 0x5d;
      goto LAB_0012d033;
    }
    UNRECOVERED_JUMPTABLE_00 = pp_Var1[1];
    pcVar8 = "[]";
LAB_0012ce05:
    uStack_50 = 2;
    goto LAB_0012d056;
  case string:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x22);
    dump_escaped(this,(string_t *)(val->m_value).object,ensure_ascii);
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar10->_vptr_output_adapter_protocol;
    uStack_50 = 0x22;
    goto LAB_0012d033;
  case boolean:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar10->_vptr_output_adapter_protocol[1];
    if ((val->m_value).boolean != true) {
      pcVar8 = "false";
LAB_0012d054:
      uStack_50 = 5;
      goto LAB_0012d056;
    }
    pcVar8 = "true";
    break;
  case number_integer:
    dump_integer<long,_0>(this,(val->m_value).number_integer);
    return;
  case number_unsigned:
    dump_integer<unsigned_long,_0>(this,(val->m_value).number_unsigned);
    return;
  case number_float:
    dump_float(this,(val->m_value).number_float);
    return;
  case binary:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if (pretty_print) {
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"{\n",2);
      uVar13 = (ulong)(indent_step + current_indent);
      uVar11 = (this->indent_string)._M_string_length;
      if (uVar11 < uVar13) {
        std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar11 * '\x02');
      }
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])
                (peVar10,(this->indent_string)._M_dataplus._M_p,uVar13);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\"bytes\": [",10);
      puVar14 = (((val->m_value).binary)->
                super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar7 = (((val->m_value).binary)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
               ).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar14 != puVar7) {
        for (; puVar14 != puVar7 + -1; puVar14 = puVar14 + 1) {
          dump_integer<unsigned_char,_0>(this,*puVar14);
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,", ",2);
          puVar7 = (uchar *)((val->m_value).string)->_M_string_length;
        }
        dump_integer<unsigned_char,_0>(this,puVar7[-1]);
      }
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"],\n",3);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])
                (peVar10,(this->indent_string)._M_dataplus._M_p,uVar13);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\"subtype\": ",0xb);
      if (((val->m_value).binary)->m_has_subtype == true) {
        dump_integer<unsigned_char,_0>(this,((val->m_value).binary)->m_subtype);
      }
      else {
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"null",4);
      }
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (**peVar10->_vptr_output_adapter_protocol)(peVar10,10);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      pcVar9 = (this->indent_string)._M_dataplus._M_p;
LAB_0012d021:
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,pcVar9,(ulong)current_indent);
    }
    else {
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"{\"bytes\":[",10);
      puVar14 = (((val->m_value).binary)->
                super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar7 = (((val->m_value).binary)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
               ).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar14 != puVar7) {
        for (; puVar14 != puVar7 + -1; puVar14 = puVar14 + 1) {
          dump_integer<unsigned_char,_0>(this,*puVar14);
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x2c);
          puVar7 = (uchar *)((val->m_value).string)->_M_string_length;
        }
        dump_integer<unsigned_char,_0>(this,puVar7[-1]);
      }
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"],\"subtype\":",0xc);
      if (((val->m_value).binary)->m_has_subtype != true) {
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        UNRECOVERED_JUMPTABLE_00 = peVar10->_vptr_output_adapter_protocol[1];
        pcVar8 = "null}";
        goto LAB_0012d054;
      }
      dump_integer<unsigned_char,_0>(this,((val->m_value).binary)->m_subtype);
    }
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar10->_vptr_output_adapter_protocol;
LAB_0012d030:
    uStack_50 = 0x7d;
LAB_0012d033:
    (*UNRECOVERED_JUMPTABLE_00)(peVar10,uStack_50);
    return;
  case discarded:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar10->_vptr_output_adapter_protocol[1];
    pcVar8 = "<discarded>";
    uStack_50 = 0xb;
    goto LAB_0012d056;
  }
  uStack_50 = 4;
LAB_0012d056:
  (*UNRECOVERED_JUMPTABLE_00)(peVar10,pcVar8,uStack_50);
  return;
}

Assistant:

void dump(const BasicJsonType& val,
              const bool pretty_print,
              const bool ensure_ascii,
              const unsigned int indent_step,
              const unsigned int current_indent = 0)
    {
        switch (val.m_type)
        {
            case value_t::object:
            {
                if (val.m_value.object->empty())
                {
                    o->write_characters("{}", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    auto i = val.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\": ", 3);
                        dump(i->second, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(i != val.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_value.object->cend());
                    o->write_characters(indent_string.c_str(), new_indent);
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\": ", 3);
                    dump(i->second, true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_character('{');

                    // first n-1 elements
                    auto i = val.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\":", 2);
                        dump(i->second, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(i != val.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_value.object->cend());
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\":", 2);
                    dump(i->second, false, ensure_ascii, indent_step, current_indent);

                    o->write_character('}');
                }

                return;
            }

            case value_t::array:
            {
                if (val.m_value.array->empty())
                {
                    o->write_characters("[]", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("[\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    for (auto i = val.m_value.array->cbegin();
                            i != val.m_value.array->cend() - 1; ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        dump(*i, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(!val.m_value.array->empty());
                    o->write_characters(indent_string.c_str(), new_indent);
                    dump(val.m_value.array->back(), true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character(']');
                }
                else
                {
                    o->write_character('[');

                    // first n-1 elements
                    for (auto i = val.m_value.array->cbegin();
                            i != val.m_value.array->cend() - 1; ++i)
                    {
                        dump(*i, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(!val.m_value.array->empty());
                    dump(val.m_value.array->back(), false, ensure_ascii, indent_step, current_indent);

                    o->write_character(']');
                }

                return;
            }

            case value_t::string:
            {
                o->write_character('\"');
                dump_escaped(*val.m_value.string, ensure_ascii);
                o->write_character('\"');
                return;
            }

            case value_t::binary:
            {
                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"bytes\": [", 10);

                    if (!val.m_value.binary->empty())
                    {
                        for (auto i = val.m_value.binary->cbegin();
                                i != val.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_characters(", ", 2);
                        }
                        dump_integer(val.m_value.binary->back());
                    }

                    o->write_characters("],\n", 3);
                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"subtype\": ", 11);
                    if (val.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_value.binary->subtype());
                    }
                    else
                    {
                        o->write_characters("null", 4);
                    }
                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_characters("{\"bytes\":[", 10);

                    if (!val.m_value.binary->empty())
                    {
                        for (auto i = val.m_value.binary->cbegin();
                                i != val.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_character(',');
                        }
                        dump_integer(val.m_value.binary->back());
                    }

                    o->write_characters("],\"subtype\":", 12);
                    if (val.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_value.binary->subtype());
                        o->write_character('}');
                    }
                    else
                    {
                        o->write_characters("null}", 5);
                    }
                }
                return;
            }

            case value_t::boolean:
            {
                if (val.m_value.boolean)
                {
                    o->write_characters("true", 4);
                }
                else
                {
                    o->write_characters("false", 5);
                }
                return;
            }

            case value_t::number_integer:
            {
                dump_integer(val.m_value.number_integer);
                return;
            }

            case value_t::number_unsigned:
            {
                dump_integer(val.m_value.number_unsigned);
                return;
            }

            case value_t::number_float:
            {
                dump_float(val.m_value.number_float);
                return;
            }

            case value_t::discarded:
            {
                o->write_characters("<discarded>", 11);
                return;
            }

            case value_t::null:
            {
                o->write_characters("null", 4);
                return;
            }

            default:            // LCOV_EXCL_LINE
                JSON_ASSERT(false);  // LCOV_EXCL_LINE
        }
    }